

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O0

Comparison __thiscall
Kernel::LiteralComparators::
Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
::compare(Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
          *this,Literal *l1,Literal *l2)

{
  Comparison CVar1;
  Literal *in_RDX;
  Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>
  *in_RSI;
  NegativeEquality *in_RDI;
  Comparison res1;
  Literal *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  
  CVar1 = NegativeEquality::compare
                    (in_RDI,(Literal *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                     ,in_stack_ffffffffffffffc8);
  if (CVar1 == EQUAL) {
    CVar1 = Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>
            ::compare(in_RSI,in_RDX,(Literal *)(ulong)in_stack_ffffffffffffffe0);
  }
  return CVar1;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    Comparison res1=_c1.compare(l1,l2);
    return (res1==EQUAL)?_c2.compare(l1,l2):res1;
  }